

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall ast::ForRangeStmt::~ForRangeStmt(ForRangeStmt *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__ForRangeStmt_001257e0;
  if (this->target != (Identifier *)0x0) {
    (*(this->target->super_Expr).super_Node._vptr_Node[1])();
  }
  this->target = (Identifier *)0x0;
  if (this->iter != (RangeExpr *)0x0) {
    (*(this->iter->super_Expr).super_Node._vptr_Node[1])();
  }
  this->iter = (RangeExpr *)0x0;
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  this->body = (BlockStmt *)0x0;
  (this->tok)._vptr_Token = (_func_int **)&PTR__Token_001258b0;
  pcVar1 = (this->tok).Literal._M_dataplus._M_p;
  paVar2 = &(this->tok).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~ForRangeStmt(){
        delete  target;
        target = nullptr;
        delete iter;
        iter = nullptr;
        delete body;
        body = nullptr;
    }